

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O3

void __thiscall
jpge::jpeg_encoder::optimize_huffman_table(jpeg_encoder *this,int table_num,int table_len)

{
  uint8 (*pauVar1) [17];
  uint8 uVar2;
  byte bVar3;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  int *piVar18;
  uint *puVar19;
  uint i;
  uint *puVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  bool bVar26;
  int iVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  int num_codes [33];
  sym_freq syms0 [257];
  sym_freq syms1 [257];
  undefined8 uStack_2450;
  int local_2448;
  ushort local_2444 [30];
  int local_2408;
  int aiStack_2404 [239];
  int aiStack_2048 [256];
  int aiStack_1c48 [256];
  int local_1848 [256];
  uint auStack_1448 [256];
  uint local_1048 [516];
  uint local_838 [514];
  byte bVar4;
  byte bVar5;
  
  piVar18 = &local_2448;
  local_1048[0] = 1;
  local_1048[1] = 0;
  lVar24 = (long)table_num;
  if (table_len < 1) {
    uStack_2450 = 0x15533d;
    memset(&local_2448,0,0x1000);
    uVar12 = 1;
LAB_00155342:
    uVar8 = 0;
    do {
      uVar22 = local_1048[uVar8 * 2];
      (&local_2448)[uVar22 & 0xff] = (&local_2448)[uVar22 & 0xff] + 1;
      piVar11 = (int *)((long)aiStack_2048 + (ulong)(uVar22 >> 6 & 0x3fc));
      *piVar11 = *piVar11 + 1;
      piVar11 = (int *)((long)aiStack_1c48 + (ulong)(uVar22 >> 0xe & 0x3fc));
      *piVar11 = *piVar11 + 1;
      piVar11 = (int *)((long)local_1848 + (ulong)(uVar22 >> 0x16 & 0xfffffffc));
      *piVar11 = *piVar11 + 1;
      uVar8 = uVar8 + 1;
    } while (uVar12 != uVar8);
    bVar26 = false;
    uVar8 = (ulong)uVar12;
  }
  else {
    uVar12 = 1;
    uVar8 = 0;
    do {
      uVar22 = this->m_huff_count[lVar24][uVar8];
      if (uVar22 != 0) {
        lVar15 = (long)(int)uVar12;
        local_1048[lVar15 * 2] = uVar22;
        uVar12 = uVar12 + 1;
        local_1048[lVar15 * 2 + 1] = (int)uVar8 + 1;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)table_len);
    uVar8 = 0;
    uStack_2450 = 0x155326;
    memset(&local_2448,0,0x1000);
    if (uVar12 != 0) goto LAB_00155342;
    bVar26 = true;
  }
  uVar9 = 4;
  piVar11 = local_1848;
  do {
    iVar25 = (int)uVar8;
    if (*piVar11 != iVar25) goto LAB_001553b6;
    uVar9 = uVar9 - 1;
    piVar11 = piVar11 + -0x100;
  } while (1 < uVar9);
  uVar9 = 1;
LAB_001553b6:
  uVar14 = 0;
  bVar7 = 0;
  puVar19 = local_838;
  puVar20 = local_1048;
  do {
    puVar16 = puVar19;
    lVar15 = 0;
    uVar12 = 0;
    do {
      auStack_1448[lVar15] = uVar12;
      uVar12 = uVar12 + *(int *)((long)piVar18 + lVar15 * 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0x100);
    if (!bVar26) {
      uVar21 = 0;
      do {
        uVar22 = puVar20[uVar21 * 2] >> (bVar7 & 0x1f) & 0xff;
        uVar12 = auStack_1448[uVar22];
        auStack_1448[uVar22] = uVar12 + 1;
        *(undefined8 *)(puVar16 + (ulong)uVar12 * 2) = *(undefined8 *)(puVar20 + uVar21 * 2);
        uVar21 = uVar21 + 1;
      } while (uVar8 != uVar21);
    }
    uVar14 = uVar14 + 1;
    bVar7 = bVar7 + 8;
    piVar18 = (int *)((long)piVar18 + 0x400);
    puVar19 = puVar20;
    puVar20 = puVar16;
  } while (uVar14 != (uVar9 & 0xffffffff));
  if (iVar25 == 1) {
    *puVar16 = 1;
    uStack_2450 = 0x155478;
    memset(&local_2448,0,0x84);
  }
  else {
    if (iVar25 == 0) {
      uStack_2450 = 0x15545c;
      memset(&local_2448,0,0x84);
      goto LAB_00155665;
    }
    *puVar16 = *puVar16 + puVar16[2];
    uVar12 = iVar25 - 1;
    if (iVar25 < 3) {
      puVar16[(long)iVar25 * 2 + -4] = 0;
    }
    else {
      iVar17 = 0;
      iVar13 = 2;
      uVar9 = 1;
      do {
        lVar15 = (long)iVar17;
        if ((iVar13 < iVar25) && (lVar23 = (long)iVar13, puVar16[lVar23 * 2] <= puVar16[lVar15 * 2])
           ) {
          iVar13 = iVar13 + 1;
          puVar16[uVar9 * 2] = puVar16[lVar23 * 2];
        }
        else {
          puVar16[uVar9 * 2] = puVar16[lVar15 * 2];
          iVar17 = iVar17 + 1;
          puVar16[lVar15 * 2] = (uint)uVar9;
          lVar15 = (long)iVar17;
        }
        if (iVar13 < iVar25) {
          if (lVar15 < (long)uVar9) {
            uVar22 = puVar16[lVar15 * 2];
            uVar10 = puVar16[(long)iVar13 * 2];
            if (uVar22 < uVar10) goto LAB_001554fc;
          }
          else {
            uVar10 = puVar16[(long)iVar13 * 2];
          }
          iVar13 = iVar13 + 1;
          puVar16[uVar9 * 2] = puVar16[uVar9 * 2] + uVar10;
        }
        else {
          uVar22 = puVar16[lVar15 * 2];
LAB_001554fc:
          puVar16[uVar9 * 2] = puVar16[uVar9 * 2] + uVar22;
          iVar17 = iVar17 + 1;
          puVar16[lVar15 * 2] = (uint)uVar9;
        }
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
      puVar16[(long)iVar25 * 2 + -4] = 0;
      uVar9 = (ulong)(iVar25 - 3);
      do {
        puVar16[uVar9 * 2] = puVar16[(ulong)puVar16[uVar9 * 2] * 2] + 1;
        bVar26 = uVar9 != 0;
        uVar9 = uVar9 - 1;
      } while (bVar26);
    }
    uVar22 = iVar25 - 2;
    iVar13 = 1;
    uVar10 = 0;
    do {
      if ((int)uVar22 < 0) {
        iVar17 = 0;
      }
      else {
        iVar27 = uVar22 + 1;
        iVar17 = 0;
        do {
          if (puVar16[(ulong)uVar22 * 2] != uVar10) goto LAB_0015558c;
          iVar17 = iVar17 + 1;
          uVar22 = uVar22 - 1;
        } while (iVar27 != iVar17);
        uVar22 = 0xffffffff;
        iVar17 = iVar27;
      }
LAB_0015558c:
      if (iVar17 < iVar13) {
        puVar19 = puVar16 + (long)(int)uVar12 * 2;
        uVar12 = (uVar12 + iVar17) - iVar13;
        do {
          *puVar19 = uVar10;
          iVar13 = iVar13 + -1;
          puVar19 = puVar19 + -2;
        } while (iVar17 < iVar13);
      }
      iVar13 = iVar17 * 2;
      uVar10 = uVar10 + 1;
    } while (iVar17 != 0);
    uStack_2450 = 0x1555c6;
    memset(&local_2448,0,0x84);
    if (iVar25 < 1) goto LAB_00155665;
  }
  uVar9 = 0;
  do {
    (&local_2448)[puVar16[uVar9 * 2]] = (&local_2448)[puVar16[uVar9 * 2]] + 1;
    uVar9 = uVar9 + 1;
  } while (uVar8 != uVar9);
  if (1 < iVar25) {
    iVar13 = 0;
    iVar17 = 0;
    iVar27 = 0;
    lVar15 = 0;
    do {
      local_2408 = local_2408 + aiStack_2404[lVar15];
      iVar13 = iVar13 + aiStack_2404[lVar15 + 1];
      iVar17 = iVar17 + aiStack_2404[lVar15 + 2];
      iVar27 = iVar27 + aiStack_2404[lVar15 + 3];
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x10);
    local_2408 = iVar27 + iVar13 + iVar17 + local_2408;
    uVar9 = 0x11;
    bVar7 = 0;
    iVar13 = 0;
    do {
      iVar13 = iVar13 + (*(int *)((long)&uStack_2450 + uVar9 * 4 + 4) << (bVar7 & 0x1f));
      uVar9 = uVar9 - 1;
      bVar7 = bVar7 + 1;
    } while (1 < uVar9);
    for (; iVar13 != 0x10000; iVar13 = iVar13 + -1) {
      local_2408 = local_2408 + -1;
      uVar9 = 0x10;
      do {
        uVar12 = (int)uVar9 - 1;
        uVar9 = (ulong)uVar12;
        if ((&local_2448)[uVar9] != 0) {
          (&local_2448)[uVar9] = (&local_2448)[uVar9] + -1;
          *(int *)(local_2444 + uVar9 * 2) = *(int *)(local_2444 + uVar9 * 2) + 2;
          break;
        }
      } while (1 < uVar12);
    }
  }
LAB_00155665:
  pauVar1 = this->m_huff_bits + lVar24;
  *(uint8 *)((long)pauVar1 + 0) = '\0';
  *(uint8 *)((long)pauVar1 + 1) = '\0';
  *(uint8 *)((long)pauVar1 + 2) = '\0';
  *(uint8 *)((long)pauVar1 + 3) = '\0';
  *(uint8 *)((long)pauVar1 + 4) = '\0';
  *(uint8 *)((long)pauVar1 + 5) = '\0';
  *(uint8 *)((long)pauVar1 + 6) = '\0';
  *(uint8 *)((long)pauVar1 + 7) = '\0';
  *(uint8 *)((long)pauVar1 + 8) = '\0';
  *(uint8 *)((long)pauVar1 + 9) = '\0';
  *(uint8 *)((long)pauVar1 + 10) = '\0';
  *(uint8 *)((long)pauVar1 + 0xb) = '\0';
  *(uint8 *)((long)pauVar1 + 0xc) = '\0';
  *(uint8 *)((long)pauVar1 + 0xd) = '\0';
  *(uint8 *)((long)pauVar1 + 0xe) = '\0';
  *(uint8 *)((long)pauVar1 + 0xf) = '\0';
  this->m_huff_bits[lVar24][0x10] = '\0';
  lVar15 = 0;
  do {
    uVar28 = local_2444[lVar15 * 2] & 0xff;
    uVar29 = local_2444[lVar15 * 2 + 2] & 0xff;
    uVar30 = local_2444[lVar15 * 2 + 4] & 0xff;
    uVar31 = local_2444[lVar15 * 2 + 6] & 0xff;
    bVar7 = (uVar28 != 0) * (uVar28 < 0x100) * (char)local_2444[lVar15 * 2] - (0xff < uVar28);
    bVar3 = (uVar29 != 0) * (uVar29 < 0x100) * (char)local_2444[lVar15 * 2 + 2] - (0xff < uVar29);
    bVar4 = (uVar30 != 0) * (uVar30 < 0x100) * (char)local_2444[lVar15 * 2 + 4] - (0xff < uVar30);
    bVar5 = (uVar31 != 0) * (uVar31 < 0x100) * (char)local_2444[lVar15 * 2 + 6] - (0xff < uVar31);
    *(uint *)(this->m_huff_bits[lVar24] + lVar15 + 1) =
         CONCAT13((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                  CONCAT12((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                           CONCAT11((bVar3 != 0) * (bVar3 < 0x100) * bVar3 - (0xff < bVar3),
                                    (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7))));
    lVar15 = lVar15 + 4;
  } while (lVar15 != 0x10);
  uVar9 = 0x11;
  do {
    uVar12 = (int)uVar9 - 1;
    uVar9 = (ulong)uVar12;
    uVar2 = this->m_huff_bits[lVar24][uVar9];
    if (uVar2 != '\0') {
      this->m_huff_bits[lVar24][uVar9] = uVar2 + 0xff;
      break;
    }
  } while (1 < uVar12);
  if (1 < iVar25) {
    uVar9 = uVar8 + 1;
    pcVar6 = (char *)((long)this + ((lVar24 * 0x100 + (ulong)(iVar25 - 1)) - uVar8) + 0x1891);
    do {
      *pcVar6 = (char)puVar16[uVar9 * 2 + -3] + -1;
      uVar9 = uVar9 - 1;
      pcVar6 = pcVar6 + 1;
    } while (2 < uVar9);
  }
  return;
}

Assistant:

void jpeg_encoder::optimize_huffman_table(int table_num, int table_len)
	{
		sym_freq syms0[MAX_HUFF_SYMBOLS], syms1[MAX_HUFF_SYMBOLS];
		syms0[0].m_key = 1; syms0[0].m_sym_index = 0;  // dummy symbol, assures that no valid code contains all 1's
		int num_used_syms = 1;
		const uint32* pSym_count = &m_huff_count[table_num][0];
		for (int i = 0; i < table_len; i++)
			if (pSym_count[i]) { syms0[num_used_syms].m_key = pSym_count[i]; syms0[num_used_syms++].m_sym_index = i + 1; }
		sym_freq* pSyms = radix_sort_syms(num_used_syms, syms0, syms1);
		calculate_minimum_redundancy(pSyms, num_used_syms);

		// Count the # of symbols of each code size.
		int num_codes[1 + MAX_HUFF_CODESIZE]; clear_obj(num_codes);
		for (int i = 0; i < num_used_syms; i++)
			num_codes[pSyms[i].m_key]++;

		const uint JPGE_CODE_SIZE_LIMIT = 16; // the maximum possible size of a JPEG Huffman code (valid range is [9,16] - 9 vs. 8 because of the dummy symbol)
		huffman_enforce_max_code_size(num_codes, num_used_syms, JPGE_CODE_SIZE_LIMIT);

		// Compute m_huff_bits array, which contains the # of symbols per code size.
		clear_obj(m_huff_bits[table_num]);
		for (int i = 1; i <= (int)JPGE_CODE_SIZE_LIMIT; i++)
			m_huff_bits[table_num][i] = static_cast<uint8>(num_codes[i]);

		// Remove the dummy symbol added above, which must be in largest bucket.
		for (int i = JPGE_CODE_SIZE_LIMIT; i >= 1; i--)
		{
			if (m_huff_bits[table_num][i]) { m_huff_bits[table_num][i]--; break; }
		}

		// Compute the m_huff_val array, which contains the symbol indices sorted by code size (smallest to largest).
		for (int i = num_used_syms - 1; i >= 1; i--)
			m_huff_val[table_num][num_used_syms - 1 - i] = static_cast<uint8>(pSyms[i].m_sym_index - 1);
	}